

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidgetPrivate::syncBackingStore(QWidgetPrivate *this)

{
  long *plVar1;
  long *plVar2;
  QRegionData *pQVar3;
  long lVar4;
  QWidgetRepaintManager *this_00;
  bool bVar5;
  long lVar6;
  long in_FS_OFFSET;
  QRegion local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = shouldPaintOnScreen(this);
  if (bVar5) {
    paintOnScreen(this,&this->dirty);
    QRegion::QRegion(&local_20);
    pQVar3 = (this->dirty).d;
    (this->dirty).d = local_20.d;
    local_20.d = pQVar3;
    QRegion::~QRegion(&local_20);
  }
  else {
    lVar6 = *(long *)&this->field_0x8;
    do {
      plVar1 = (long *)(lVar6 + 8);
      lVar4 = *(long *)(*plVar1 + 0x10);
      if (lVar4 == 0) break;
      plVar2 = (long *)(lVar6 + 0x20);
      lVar6 = lVar4;
    } while ((*(uint *)(*plVar2 + 0xc) & 1) == 0);
    lVar6 = *(long *)(*plVar1 + 0x78);
    if (((lVar6 != 0) && (lVar6 = *(long *)(lVar6 + 8), lVar6 != 0)) &&
       (this_00 = *(QWidgetRepaintManager **)(lVar6 + 8), this_00 != (QWidgetRepaintManager *)0x0))
    {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QWidgetRepaintManager::sync(this_00);
        return;
      }
      goto LAB_002faa46;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_002faa46:
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::syncBackingStore()
{
    if (shouldPaintOnScreen()) {
        paintOnScreen(dirty);
        dirty = QRegion();
    } else if (QWidgetRepaintManager *repaintManager = maybeRepaintManager()) {
        repaintManager->sync();
    }
}